

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O0

string * RigidBodyDynamics::Utils::GetModelHierarchy_abi_cxx11_(Model *model)

{
  _Ios_Openmode _Var1;
  string *in_RDI;
  stringstream result;
  int in_stack_00000320;
  uint in_stack_00000324;
  Model *in_stack_00000328;
  string local_1f0 [16];
  allocator<char> *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  allocator<char> local_1b9;
  string local_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  _Var1 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_198,local_1b8,_Var1);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  print_hierarchy_abi_cxx11_(in_stack_00000328,in_stack_00000324,in_stack_00000320);
  std::operator<<(local_188,local_1f0);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

RBDL_DLLAPI std::string GetModelHierarchy (const Model &model)
{
  stringstream result ("");

  result << print_hierarchy (model);

  return result.str();
}